

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Sampling_Tent_Test::TestBody(Sampling_Tent_Test *this)

{
  Allocator alloc;
  bool bVar1;
  int in_EDI;
  int iVar2;
  Float FVar3;
  Float FVar4;
  float fVar5;
  uint uVar6;
  float fVar7;
  Float FVar8;
  AssertionResult gtest_ar_;
  anon_class_1_0_00000001 checkErr;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  Float dx;
  Float dp;
  Float tp;
  Float tx;
  Float u;
  int i;
  PiecewiseConstant1D distrib;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  anon_class_8_1_69325dd0 tent;
  Float radius;
  Float *__end1;
  Float *__begin1;
  Float (*__range1) [3];
  RNG rng;
  Float rad [3];
  AssertionResult gtest_ar;
  Float dist;
  Message *in_stack_fffffffffffffcf8;
  Float in_stack_fffffffffffffd00;
  Float in_stack_fffffffffffffd04;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffd08;
  function<float_(float)> *in_stack_fffffffffffffd10;
  Message *in_stack_fffffffffffffd18;
  Message *in_stack_fffffffffffffd20;
  Message *in_stack_fffffffffffffd28;
  AssertHelper *in_stack_fffffffffffffd30;
  Message *in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  Float in_stack_fffffffffffffd4c;
  PiecewiseConstant1D *in_stack_fffffffffffffd50;
  Message *in_stack_fffffffffffffd60;
  Message *in_stack_fffffffffffffd68;
  Message *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  AssertHelper *in_stack_fffffffffffffd80;
  Message *in_stack_fffffffffffffd88;
  function<float_(float)> *in_stack_fffffffffffffd90;
  Allocator in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  uint uVar9;
  char *in_stack_fffffffffffffdc8;
  char *expr1;
  string local_208 [24];
  Float in_stack_fffffffffffffe10;
  Float in_stack_fffffffffffffe14;
  PiecewiseConstant1D *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  Float in_stack_fffffffffffffe24;
  span<const_float> in_stack_fffffffffffffe28;
  AssertionResult local_198 [2];
  undefined8 local_178;
  float local_16c;
  AssertionResult local_168;
  Float local_158;
  float local_154;
  Float local_150;
  Float local_14c;
  float local_148;
  int local_144;
  undefined1 local_128 [88];
  char local_d0 [64];
  uint *local_90;
  uint local_84;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  RNG local_68;
  uint local_54 [11];
  undefined8 local_28;
  AssertionResult local_20;
  float local_c;
  
  FVar3 = pbrt::SampleTent(SUB84(in_stack_fffffffffffffd30,0),
                           (Float)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  FVar4 = pbrt::SampleTent(SUB84(in_stack_fffffffffffffd30,0),
                           (Float)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  fVar5 = FVar3 - FVar4;
  std::abs(in_EDI);
  local_28 = 0x3f847ae147ae147b;
  local_c = fVar5;
  testing::internal::CmpHelperLT<float,double>
            (in_stack_fffffffffffffdc8,
             (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (float *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (double *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::AssertionResult::failure_message((AssertionResult *)0x63ec4d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
               (char *)in_stack_fffffffffffffd10);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,
               (Message *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    testing::Message::~Message((Message *)0x63ecb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x63ed08);
  local_54[0] = 0x3f800000;
  local_54[1] = 0x40200000;
  local_54[2] = 0x3e000000;
  pbrt::RNG::RNG(&local_68);
  local_80 = local_54 + 3;
  local_78 = local_54;
  local_70 = local_78;
  for (; local_78 != local_80; local_78 = local_78 + 1) {
    local_84 = *local_78;
    local_90 = &local_84;
    expr1 = local_d0;
    std::function<float(float)>::function<Sampling_Tent_Test::TestBody()::__0&,void>
              (in_stack_fffffffffffffd10,(anon_class_8_1_69325dd0 *)in_stack_fffffffffffffd08);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    pbrt::Sample1DFunction
              (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               (int)in_stack_fffffffffffffd88,(Float)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               SUB84(in_stack_fffffffffffffd80,0),in_stack_fffffffffffffd98);
    std::function<float_(float)>::~function((function<float_(float)> *)0x63ee3a);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              ((span<const_float> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    uVar6 = local_84 ^ 0x80000000;
    uVar9 = local_84;
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    alloc.memoryResource._4_4_ = in_stack_fffffffffffffe24;
    alloc.memoryResource._0_4_ = in_stack_fffffffffffffe20;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe28,in_stack_fffffffffffffe14,
               in_stack_fffffffffffffe10,alloc);
    for (local_144 = 0; local_144 < 100; local_144 = local_144 + 1) {
      fVar7 = pbrt::RNG::Uniform<float>
                        ((RNG *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      local_148 = fVar7;
      FVar3 = pbrt::SampleTent(SUB84(in_stack_fffffffffffffd30,0),
                               (Float)((ulong)in_stack_fffffffffffffd28 >> 0x20));
      local_14c = FVar3;
      FVar4 = pbrt::TentPDF(in_stack_fffffffffffffd00,
                            (Float)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      iVar2 = (int)local_128;
      local_150 = FVar4;
      FVar8 = pbrt::PiecewiseConstant1D::Sample
                        (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                         (Float *)CONCAT17(in_stack_fffffffffffffd47,
                                           CONCAT16(in_stack_fffffffffffffd46,
                                                    in_stack_fffffffffffffd40)),
                         (int *)in_stack_fffffffffffffd38);
      fVar5 = local_14c - FVar8;
      local_158 = FVar8;
      std::abs(iVar2);
      local_178 = 0x3f689374bc6a7efa;
      local_16c = fVar5;
      testing::internal::CmpHelperLT<float,double>
                (expr1,(char *)CONCAT44(uVar9,uVar6),(float *)CONCAT44(fVar7,FVar3),
                 (double *)CONCAT44(FVar4,FVar8));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd30);
        testing::Message::operator<<
                  ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (char (*) [15])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd98.memoryResource =
             (memory_resource *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd90 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [13])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd88 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd80 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x63f162);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                   (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd80,
                   (Message *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        testing::Message::~Message((Message *)0x63f1c5);
      }
      iVar2 = (int)&local_168;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x63f21d);
      in_stack_fffffffffffffd7c = local_150 - local_154;
      std::abs(iVar2);
      testing::internal::CmpHelperLT<float,double>
                (expr1,(char *)CONCAT44(uVar9,uVar6),(float *)CONCAT44(fVar7,FVar3),
                 (double *)CONCAT44(FVar4,FVar8));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
      in_stack_fffffffffffffd78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd78);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd30);
        in_stack_fffffffffffffd70 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [19])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd68 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd60 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [17])in_stack_fffffffffffffcf8);
        testing::Message::operator<<
                  ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd50 =
             (PiecewiseConstant1D *)
             testing::AssertionResult::failure_message((AssertionResult *)0x63f368);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                   (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd80,
                   (Message *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        testing::Message::~Message((Message *)0x63f3c2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x63f41a);
      in_stack_fffffffffffffd4c =
           pbrt::InvertTentSample
                     (in_stack_fffffffffffffd00,(Float)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      in_stack_fffffffffffffd47 =
           TestBody::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd10,
                      (Float)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                      SUB84(in_stack_fffffffffffffd08,0));
      testing::AssertionResult::AssertionResult
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 SUB81((ulong)in_stack_fffffffffffffcf8 >> 0x38,0));
      in_stack_fffffffffffffd46 =
           testing::AssertionResult::operator_cast_to_bool
                     ((AssertionResult *)&stack0xfffffffffffffe30);
      if (!(bool)in_stack_fffffffffffffd46) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd30);
        in_stack_fffffffffffffd38 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [3])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd30 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd28 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [9])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd20 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd18 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [4])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd10 =
             (function<float_(float)> *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd08 =
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (char (*) [10])in_stack_fffffffffffffcf8);
        in_stack_fffffffffffffd04 =
             pbrt::InvertTentSample
                       (in_stack_fffffffffffffd00,(Float)((ulong)in_stack_fffffffffffffcf8 >> 0x20))
        ;
        in_stack_fffffffffffffe24 = in_stack_fffffffffffffd04;
        in_stack_fffffffffffffcf8 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                        (float *)in_stack_fffffffffffffcf8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (char *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68,
                   (char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                   (char *)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd80,
                   (Message *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        std::__cxx11::string::~string(local_208);
        testing::Message::~Message((Message *)0x63f668);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x63f6e0);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D
              ((PiecewiseConstant1D *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
    ;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  }
  return;
}

Assistant:

TEST(Sampling, Tent) {
    // Make sure stratification is preserved at the midpoint of the
    // sampling domain.
    Float dist = std::abs(SampleTent(.501, 1) - SampleTent(.499, 1));
    EXPECT_LT(dist, .01);

    Float rad[] = {Float(1), Float(2.5), Float(.125)};
    RNG rng;
    for (Float radius : rad) {
        auto tent = [&](Float x) { return std::max<Float>(0, 1 - std::abs(x) / radius); };

        auto values = Sample1DFunction(tent, 8192, 64, -radius, radius);
        PiecewiseConstant1D distrib(values, -radius, radius);
        for (int i = 0; i < 100; ++i) {
            Float u = rng.Uniform<Float>();
            Float tx = SampleTent(u, radius);
            Float tp = TentPDF(tx, radius);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(tx - dx), 3e-3)
                << "Closed form = " << tx << ", distrib = " << dx;
            EXPECT_LT(std::abs(tp - dp), 3e-3)
                << "Closed form PDF = " << tp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTentSample(tx, radius)))
                << "u " << u << " radius " << radius << " x " << tx << " inverse "
                << InvertTentSample(tx, radius);
        }
    }
}